

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hdwallet.cpp
# Opt level: O2

void __thiscall
HDWallet_ConvertMnemonicToEntropyErrorTest_Test::~HDWallet_ConvertMnemonicToEntropyErrorTest_Test
          (HDWallet_ConvertMnemonicToEntropyErrorTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HDWallet, ConvertMnemonicToEntropyErrorTest) {
  ByteData actual_entropy;
  try {
    // check empty mnemonic
    EXPECT_THROW(actual_entropy = HDWallet::ConvertMnemonicToEntropy(empty_mnemonic, language), CfdException);

    // check invalid mnemonic
    EXPECT_THROW(actual_entropy = HDWallet::ConvertMnemonicToEntropy(invalid_words_mnemonic, language), CfdException);
  } catch (CfdException &e) {
    EXPECT_STREQ(e.what(), "Convert mnemonic to entropy error.");
  } catch (...) {
    // force to fail test
    EXPECT_TRUE(false);
  }

  try {
    std::vector<std::string> mnemonic = bip39_test_vectors[0].mnemonic;
    EXPECT_THROW(actual_entropy = HDWallet::ConvertMnemonicToEntropy(mnemonic, "zz"), CfdException);
  } catch (CfdException &e) {
    EXPECT_STREQ(e.what(), "Not support language passed.");
  } catch (...) {
    // force to fail test
    EXPECT_TRUE(false);
  }
}